

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warm_cb.cc
# Opt level: O2

void learn_sup_adf<false>(warm_cb *data,example *ec,int ec_type)

{
  multi_ex *ec_00;
  undefined8 *puVar1;
  label *plVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  multi_learner *this;
  size_t a_2;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  size_t a_1;
  uint32_t i;
  float fVar10;
  vector<float,_std::allocator<float>_> old_weights;
  _Vector_base<float,_std::allocator<float>_> local_48;
  
  copy_example_to_adf(data,ec);
  lVar7 = 0;
  uVar9 = 0;
  while (uVar8 = (ulong)data->num_actions, uVar9 < uVar8) {
    uVar9 = uVar9 + 1;
    *(uint32_t *)(*(long *)((long)&(data->csls->costs)._begin + lVar7) + 4) = (uint32_t)uVar9;
    **(float **)((long)&(data->csls->costs)._begin + lVar7) =
         (&data->loss0)[(uint32_t)uVar9 != (ec->l).multi.label];
    lVar7 = lVar7 + 0x20;
  }
  ec_00 = &data->ecs;
  lVar7 = 0;
  for (uVar9 = 0; uVar9 < uVar8; uVar9 = uVar9 + 1) {
    plVar2 = data->cbls;
    lVar3 = *(long *)((long)(data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar7);
    uVar4 = *(undefined8 *)(lVar3 + 0x6828);
    uVar5 = *(undefined8 *)(lVar3 + 0x6830);
    uVar6 = *(undefined8 *)(lVar3 + 0x6840);
    puVar1 = (undefined8 *)((long)&(plVar2->costs).end_array + lVar7 * 4);
    *puVar1 = *(undefined8 *)(lVar3 + 0x6838);
    puVar1[1] = uVar6;
    puVar1 = (undefined8 *)((long)&(plVar2->costs)._begin + lVar7 * 4);
    *puVar1 = uVar4;
    puVar1[1] = uVar5;
    lVar3 = *(long *)((long)(data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar7);
    puVar1 = (undefined8 *)((long)&(data->csls->costs)._begin + lVar7 * 4);
    uVar4 = *puVar1;
    uVar5 = puVar1[1];
    puVar1 = (undefined8 *)((long)&(data->csls->costs).end_array + lVar7 * 4);
    uVar6 = puVar1[1];
    *(undefined8 *)(lVar3 + 0x6838) = *puVar1;
    *(undefined8 *)(lVar3 + 0x6840) = uVar6;
    *(undefined8 *)(lVar3 + 0x6828) = uVar4;
    *(undefined8 *)(lVar3 + 0x6830) = uVar5;
    uVar8 = (ulong)data->num_actions;
    lVar7 = lVar7 + 8;
  }
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar9 = 0; uVar9 < uVar8; uVar9 = uVar9 + 1) {
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)&local_48,
               &(ec_00->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar9]->weight);
    uVar8 = (ulong)data->num_actions;
  }
  for (uVar9 = 0; uVar9 < data->choices_lambda; uVar9 = uVar9 + 1) {
    fVar10 = compute_weight_multiplier(data,uVar9,ec_type);
    for (uVar8 = 0; uVar8 < data->num_actions; uVar8 = uVar8 + 1) {
      (ec_00->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar8]->weight =
           local_48._M_impl.super__Vector_impl_data._M_start[uVar8] * fVar10;
    }
    this = LEARNER::as_multiline<char,char>(data->all->cost_sensitive);
    LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::learn
              (this,ec_00,uVar9);
  }
  for (uVar9 = 0; uVar8 = (ulong)data->num_actions, uVar9 < uVar8; uVar9 = uVar9 + 1) {
    (ec_00->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar9]->weight =
         local_48._M_impl.super__Vector_impl_data._M_start[uVar9];
  }
  lVar7 = 0;
  for (uVar9 = 0; uVar9 < uVar8; uVar9 = uVar9 + 1) {
    lVar3 = *(long *)((long)(data->ecs).super__Vector_base<example_*,_std::allocator<example_*>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar7);
    puVar1 = (undefined8 *)((long)&(data->cbls->costs)._begin + lVar7 * 4);
    uVar4 = *puVar1;
    uVar5 = puVar1[1];
    puVar1 = (undefined8 *)((long)&(data->cbls->costs).end_array + lVar7 * 4);
    uVar6 = puVar1[1];
    *(undefined8 *)(lVar3 + 0x6838) = *puVar1;
    *(undefined8 *)(lVar3 + 0x6840) = uVar6;
    *(undefined8 *)(lVar3 + 0x6828) = uVar4;
    *(undefined8 *)(lVar3 + 0x6830) = uVar5;
    uVar8 = (ulong)data->num_actions;
    lVar7 = lVar7 + 8;
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void learn_sup_adf(warm_cb& data, example& ec, int ec_type)
{
	copy_example_to_adf(data, ec);
	//generate cost-sensitive label (for cost-sensitive learner's temporary use)
	auto& csls = data.csls;
	auto& cbls = data.cbls;
	for (size_t a = 0; a < data.num_actions; ++a)
	{
		csls[a].costs[0].class_index = a+1;
		if (use_cs)
			csls[a].costs[0].x = loss_cs(data, ec.l.cs.costs, a+1);
 		else
			csls[a].costs[0].x = loss(data, ec.l.multi.label, a+1);
	}
	for (size_t a = 0; a < data.num_actions; ++a)
	{
		cbls[a] = data.ecs[a]->l.cb;
		data.ecs[a]->l.cs = csls[a];
	}

	vector<float> old_weights;
	for (size_t a = 0; a < data.num_actions; ++a)
		old_weights.push_back(data.ecs[a]->weight);

	for (uint32_t i = 0; i < data.choices_lambda; i++)
	{
		float weight_multiplier = compute_weight_multiplier(data, i, ec_type);
		for (size_t a = 0; a < data.num_actions; ++a)
			data.ecs[a]->weight = old_weights[a] * weight_multiplier;
		multi_learner* cs_learner = as_multiline(data.all->cost_sensitive);
		cs_learner->learn(data.ecs, i);
	}

	for (size_t a = 0; a < data.num_actions; ++a)
		data.ecs[a]->weight = old_weights[a];

	for (size_t a = 0; a < data.num_actions; ++a)
		data.ecs[a]->l.cb = cbls[a];
}